

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ManComputeEdgeDelay2(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vFanMax1_00;
  Vec_Int_t *vFanMax2_00;
  Vec_Int_t *vCountMax_00;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pObj;
  bool bVar3;
  Vec_Int_t *vCountMax;
  Vec_Int_t *vFanMax2;
  Vec_Int_t *vFanMax1;
  int local_18;
  int DelayMax;
  int iLut;
  int k;
  Gia_Man_t *p_local;
  
  vFanMax1._4_4_ = 0;
  iVar1 = Gia_ManObjNum(p);
  vFanMax1_00 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  vFanMax2_00 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  vCountMax_00 = Vec_IntStart(iVar1);
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                  ,0x23d,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
  }
  Vec_IntFreeP(&p->vEdgeDelay);
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_IntStart(iVar1);
  p->vEdgeDelay = pVVar2;
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_IntStart(iVar1);
  p->vEdge1 = pVVar2;
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_IntStart(iVar1);
  p->vEdge2 = pVVar2;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    iVar1 = Gia_ManHasMapping2(p);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                    ,0x24c,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
    }
    local_18 = Gia_ManObjNum(p);
    while (local_18 = local_18 + -1, 0 < local_18) {
      iVar1 = Gia_ObjIsLut2(p,local_18);
      if (iVar1 != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,local_18,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1_00,vFanMax2_00,vCountMax_00
                  );
      }
    }
  }
  else {
    local_18 = Gia_ManObjNum(p);
    while (local_18 = local_18 + -1, 0 < local_18) {
      iVar1 = Gia_ObjIsLut(p,local_18);
      if (iVar1 != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,local_18,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1_00,vFanMax2_00,vCountMax_00
                  );
      }
    }
  }
  DelayMax = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (DelayMax < iVar1) {
      pObj = Gia_ManCi(p,DelayMax);
      local_18 = Gia_ObjId(p,pObj);
      bVar3 = local_18 != 0;
    }
    if (!bVar3) break;
    iVar1 = Vec_IntEntry(p->vEdgeDelay,local_18);
    vFanMax1._4_4_ = Abc_MaxInt(vFanMax1._4_4_,iVar1);
    DelayMax = DelayMax + 1;
  }
  Vec_IntFree(vFanMax1_00);
  Vec_IntFree(vFanMax2_00);
  Vec_IntFree(vCountMax_00);
  return vFanMax1._4_4_;
}

Assistant:

int Gia_ManComputeEdgeDelay2( Gia_Man_t * p )
{
    int k, iLut, DelayMax = 0;
    Vec_Int_t * vFanMax1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vFanMax2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCountMax = Vec_IntStart( Gia_ManObjNum(p) );
    assert( p->pManTime == NULL );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelay, iLut, 1 );
    if ( Gia_ManHasMapping(p) )
        Gia_ManForEachLutReverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else if ( Gia_ManHasMapping2(p) )
        Gia_ManForEachLut2Reverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else assert( 0 );
    Gia_ManForEachCiId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    Vec_IntFree( vFanMax1 );
    Vec_IntFree( vFanMax2 );
    Vec_IntFree( vCountMax );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}